

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

bool doctest::detail::parseOptionImpl(int argc,char **argv,char *pattern,String *res)

{
  char cVar1;
  char *__haystack;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  String local_38;
  
  uVar7 = (ulong)(uint)argc;
  do {
    do {
      iVar6 = (int)uVar7;
      if (iVar6 < 1) {
LAB_0010458b:
        return 0 < iVar6;
      }
      __haystack = argv[uVar7 - 1];
      uVar7 = uVar7 - 1;
      pcVar2 = strstr(__haystack,pattern);
      pcVar3 = __haystack;
    } while (pcVar2 == (char *)0x0);
    do {
      if (pcVar3 == pcVar2) {
        if (*__haystack == '-') {
          sVar4 = my_strlen(pattern);
          sVar5 = my_strlen(pcVar2 + sVar4);
          if ((int)sVar5 != 0) {
            String::String(&local_38,pcVar2 + sVar4);
            String::operator=(res,&local_38);
            free(local_38.m_str);
            goto LAB_0010458b;
          }
        }
        break;
      }
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 == '-');
  } while( true );
}

Assistant:

bool parseOptionImpl(int argc, const char* const* argv, const char* pattern, String& res) {
        for(int i = argc - 1; i >= 0; --i) {
            const char* temp = strstr(argv[i], pattern);
            if(temp) {
                // eliminate matches in which the chars before the option are not '-'
                bool        noBadCharsFound = true;
                const char* curr            = argv[i];
                while(curr != temp) {
                    if(*curr++ != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[i][0] == '-') {
                    temp += my_strlen(pattern);
                    unsigned len = my_strlen(temp);
                    if(len) {
                        res = temp;
                        return true;
                    }
                }
            }
        }
        return false;
    }